

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_dialer nng_pipe_dialer(nng_pipe p)

{
  nng_err nVar1;
  nni_pipe *local_18;
  nni_pipe *pipe;
  nng_pipe p_local;
  nng_dialer d;
  
  pipe._0_4_ = p.id;
  memset((void *)((long)&pipe + 4),0,4);
  nVar1 = nni_pipe_find(&local_18,pipe._0_4_);
  if (nVar1 == NNG_OK) {
    pipe._4_4_ = nni_pipe_dialer_id(local_18);
    nni_pipe_rele(local_18);
  }
  return (nng_dialer)pipe._4_4_;
}

Assistant:

nng_dialer
nng_pipe_dialer(nng_pipe p)
{
	nng_dialer d = NNG_DIALER_INITIALIZER;
	nni_pipe  *pipe;
	if (nni_pipe_find(&pipe, p.id) == 0) {
		d.id = nni_pipe_dialer_id(pipe);
		nni_pipe_rele(pipe);
	}
	return (d);
}